

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week14-app2.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  optional<int> *this;
  char cVar1;
  char *pcVar2;
  constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
  *pcVar3;
  basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  bVar4;
  pointer psVar5;
  ostream *poVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  char *b;
  pointer pcVar10;
  int iVar11;
  anon_class_1_0_00000001 *this_00;
  pointer psVar12;
  constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
  *pcVar13;
  initializer_list<double> __l;
  initializer_list<char> __l_00;
  initializer_list<short> __l_01;
  initializer_list<int> __l_02;
  facade_iterator_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
  __begin1;
  allocator_type local_b1;
  double local_b0;
  vector<short> v;
  vector<double> v1;
  facade_sentinel_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
  __end1;
  vector<char> v2;
  
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4025000000000000;
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x40091eb851eb851f;
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x400599999999999a;
  __l._M_len = 4;
  __l._M_array = (iterator)&v;
  std::vector<double,_std::allocator<double>_>::vector(&v1,__l,(allocator_type *)&v2);
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT35(v.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_start._5_3_,0x3131303131);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&v;
  std::vector<char,_std::allocator<char>_>::vector(&v2,__l_00,(allocator_type *)&__begin1);
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&v1;
  local_b0 = ranges::accumulate_fn::
             operator()<ranges::take_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>_>,_double,_ranges::plus,_ranges::identity>
                       ((accumulate_fn *)0x0,&ranges::accumulate);
  poVar6 = std::ostream::_M_insert<double>(local_b0);
  std::endl<char,std::char_traits<char>>(poVar6);
  main::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)poVar6);
  poVar6 = std::ostream::_M_insert<double>(local_b0);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)&v2;
  ranges::
  view_facade<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>,_(ranges::cardinality)-1>
  ::
  begin<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>_>
            (&__begin1,
             (view_facade<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>,_(ranges::cardinality)_1>
              *)&v);
  this_00 = (anon_class_1_0_00000001 *)&__end1;
  ranges::
  view_facade<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>,_(ranges::cardinality)-1>
  ::
  end<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>_>
            ((facade_sentinel_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
              *)this_00,
             (view_facade<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>,_(ranges::cardinality)_1>
              *)&v);
  while( true ) {
    pcVar2 = (char *)CONCAT44(__begin1.
                              super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                              .
                              super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                              .
                              super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                              .
                              super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                              .value.its_.
                              super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                              .
                              super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
                              ._M_head_impl._M_current._4_4_,
                              __begin1.
                              super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                              .
                              super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                              .
                              super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                              .
                              super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                              .value.its_.
                              super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                              .
                              super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
                              ._M_head_impl._M_current._0_4_);
    bVar4.
    super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
    .
    super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
    .
    super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
    .
    super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
    .
    super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
    .value.it_._M_current._1_7_ =
         __begin1.
         super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
         .
         super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
         .
         super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
         .
         super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
         .value.its_.
         super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
         ._M_head_impl.
         super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
         .
         super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
         .
         super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
         .
         super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
         .
         super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
         .value.it_._M_current._1_7_;
    bVar4.
    super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
    .
    super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
    .
    super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
    .
    super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
    .
    super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
    .value.it_._M_current._0_1_ =
         (char)__begin1.
               super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
               .
               super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
               .
               super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
               .
               super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
               .value.its_.
               super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
               ._M_head_impl.
               super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
               .
               super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
               .
               super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
               .
               super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
               .value.it_._M_current;
    if ((pcVar2 == (char *)CONCAT62(__end1.
                                    super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                    .
                                    super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                    .
                                    super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                    .
                                    super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                    .value.its_.
                                    super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                                    .
                                    super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
                                    ._M_head_impl._M_current._2_6_,
                                    __end1.
                                    super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                    .
                                    super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                    .
                                    super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                    .
                                    super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                    .value.its_.
                                    super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                                    .
                                    super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
                                    ._M_head_impl._M_current._0_2_)) &&
       ((basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
         )bVar4.
          super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
          .
          super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
          .
          super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
          .
          super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
          .
          super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
          .value.it_._M_current ==
        __end1.
        super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
        .
        super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
        .
        super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
        .
        super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
        .value.its_.
        super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
        ._M_head_impl.
        super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
        .
        super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
        .
        super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
        .
        super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
        .
        super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
        .value.it_._M_current)) break;
    std::operator<<((ostream *)&std::cout,"[");
    poVar6 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)bVar4.
                                super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
                                .
                                super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
                                .
                                super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
                                .
                                super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                                .
                                super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
                                .value.it_._M_current + -8));
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = std::operator<<(poVar6,*pcVar2);
    poVar6 = std::operator<<(poVar6,"]");
    std::endl<char,std::char_traits<char>>(poVar6);
    this_00 = (anon_class_1_0_00000001 *)&__begin1;
    ranges::
    cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,std::allocator<double>>>>,ranges::ref_view<std::vector<char,std::allocator<char>>>>
    ::cursor<false>::next_<2ul>();
  }
  main::anon_class_1_0_00000001::operator()(this_00);
  uVar7 = (ulong)((long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  while( true ) {
    uVar7 = uVar7 - 1;
    if ((int)(uint)uVar7 < 0) break;
    local_b0 = v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)uVar7 & 0x7fffffff];
    for (pcVar10 = (pointer)0x0;
        pcVar10 < v2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                  ._M_finish +
                  ~(ulong)v2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start; pcVar10 = pcVar10 + 1) {
      cVar1 = v2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[(long)pcVar10];
      std::operator<<((ostream *)&std::cout,"[");
      poVar6 = std::ostream::_M_insert<double>(local_b0);
      poVar6 = std::operator<<(poVar6,", ");
      poVar6 = std::operator<<(poVar6,cVar1);
      poVar6 = std::operator<<(poVar6,"]");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  __begin1.
  super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.view_ = (constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
                  *)0x200000001;
  __begin1.
  super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.
  super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_current._0_1_ = 1;
  __begin1.
  super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.
  super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_current._4_4_ = 0;
  __begin1.
  super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.
  super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
  ._M_head_impl.
  super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
  .
  super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
  .
  super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  .
  super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
  .value.it_._M_current._0_1_ = '\0';
  __end1.
  super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.view_ = (constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
                  *)0x1000000010001;
  __end1.
  super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
  .
  super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.
  super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_current._0_2_ = 1;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&__end1;
  std::vector<short,_std::allocator<short>_>::vector(&v,__l_01,&local_b1);
  psVar5 = v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
  this = (optional<int> *)
         ((long)&__begin1.
                 super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                 .
                 super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                 .
                 super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                 .
                 super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                 .value.its_ + 4);
  iVar9 = 0;
  psVar12 = v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  while (psVar12 != psVar5) {
    if ((char)__begin1.
              super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
              .
              super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
              .
              super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
              .
              super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
              .value.its_.
              super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
              ._M_head_impl.
              super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
              .
              super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
              .
              super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
              .
              super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
              .value.it_._M_current == '\0') {
      iVar11 = (int)__begin1.
                    super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                    .
                    super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                    .
                    super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                    .value.view_;
      __begin1.
      super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
      .
      super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.view_ = (constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
                      *)CONCAT44(__begin1.
                                 super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                 .
                                 super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                 .value.view_._4_4_,
                                 __begin1.
                                 super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                 .
                                 super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                 .value.view_._4_4_ *
                                 (int)__begin1.
                                      super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                      .
                                      super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                      .
                                      super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                      .
                                      super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                      .value.view_);
      __end1.
      super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
      .
      super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.view_ = (constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
                      *)CONCAT44(__end1.
                                 super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                 .
                                 super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                 .value.view_._4_4_,iVar11);
      ranges::optional<int>::emplace<int>(this,(int *)&__end1);
    }
    psVar12 = psVar12 + -1;
    piVar8 = ranges::detail::optional_adl::optional_base<int>::operator*((optional_base<int> *)this)
    ;
    iVar9 = iVar9 + (int)*psVar12 * *piVar8;
    if ((char)__begin1.
              super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
              .
              super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
              .
              super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
              .
              super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
              .value.its_.
              super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
              ._M_head_impl.
              super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
              .
              super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
              .
              super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
              .
              super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
              .value.it_._M_current == '\x01') {
      __begin1.
      super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
      .
      super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.its_.
      super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
      ._M_head_impl.
      super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
      .
      super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
      .
      super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
      .
      super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
      .
      super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
      .value.it_._M_current._0_1_ = '\0';
    }
    else {
      __begin1.
      super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
      .
      super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.view_ = (constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
                      *)CONCAT44(__begin1.
                                 super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                 .
                                 super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                 .value.view_._4_4_,
                                 (int)__begin1.
                                      super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                      .
                                      super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                      .
                                      super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                      .
                                      super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                      .value.view_ *
                                 __begin1.
                                 super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                 .
                                 super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                 .
                                 super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                 .value.view_._4_4_);
    }
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
  std::endl<char,std::char_traits<char>>(poVar6);
  main::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)poVar6);
  uVar7 = (ulong)((long)v.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)v.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 1 & 0xffffffff;
  iVar9 = 1;
  iVar11 = 0;
  while( true ) {
    uVar7 = uVar7 - 1;
    if ((int)uVar7 < 0) break;
    iVar11 = iVar11 + *(short *)((long)v.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                (ulong)(uint)((int)uVar7 * 2)) * iVar9;
    iVar9 = iVar9 * 2;
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&v.super__Vector_base<short,_std::allocator<short>_>);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  ranges::actions::action_closure_base_ns::operator|=(&v1);
  for (; v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    poVar6 = std::ostream::_M_insert<double>
                       (*v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1400000005;
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xa0000000a;
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x500000005;
  __l_02._M_len = 8;
  __l_02._M_array = (iterator)&v;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&__begin1,__l_02,(allocator_type *)&__end1);
  ranges::actions::action_closure_base_ns::operator|=(&__begin1);
  pcVar3 = (constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
            *)CONCAT44(__begin1.
                       super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                       .
                       super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                       .
                       super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                       .
                       super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                       .value.its_.
                       super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                       .
                       super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
                       ._M_head_impl._M_current._4_4_,
                       __begin1.
                       super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                       .
                       super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                       .
                       super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                       .
                       super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                       .value.its_.
                       super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                       .
                       super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>,_false>
                       ._M_head_impl._M_current._0_4_);
  for (pcVar13 = __begin1.
                 super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                 .
                 super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                 .
                 super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                 .
                 super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                 .value.view_; pcVar13 != pcVar3;
      pcVar13 = (constify_if<cartesian_product_view<reverse_view<ref_view<vector<double>_>_>,_ref_view<vector<char>_>_>_>
                 *)&pcVar13->field_0x4) {
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)pcVar13);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&__begin1);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&v2.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v1.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto horizontal_line = [] { std::cout << "------" << std::endl; };
    auto new_line = [] { std::cout << std::endl; };

    auto v1 = vector<double>{3.14, 2.7, 10.5, 20.1};
    auto v2 = vector<char>{'1', '1', '0', '1', '1'};

    { // example #1: accumulate
        // below is a single for loop implementation summing things up
        auto sum1 = accumulate(v1 | views::reverse | views::take(2), 0.0);
        std::cout << sum1 << std::endl;

        horizontal_line();

        // this is the old-school way of writing it
        auto sum2 = 0.0;
        for(size_t i=v1.size()-1; i>=v1.size()-1-2; --i)
            sum2 += v1[i];
        std::cout << sum1 << std::endl;
    }
    new_line();

    { // example #2: nested-for-loop implementation with ranges
        // below is a nested-for-loop equivalent of going over v1 and v2.
        // nesting is actually equivalent to taking cartesian_product in mathematics
        for(auto [a, b] : views::cartesian_product(v1 | views::reverse, v2))
            std::cout << "[" << a << ", " << b << "]" << std::endl;

        horizontal_line();

        // this is the old-school nested for loop version! very prone to bugs.
        for(int i=v1.size()-1; i>=0; --i)
        {
            auto a = v1[i];
            for(size_t j=0; j<v2.size()-1; ++j)
            {
                auto b = v2[j];
                std::cout << "[" << a << ", " << b << "]" << std::endl;
            }
        }
    }
    new_line();

    { // example #3: inner-product (dot-product) -> single for-loop coupled with some other action

        // this is a generator that returns 1, k^1, k^2, k^3, k^4, ... respectively for each call
        auto powers_of_k = [](auto k) {
            return [i=1, k]() mutable { return (i*=k)/k; };
        };

        // make it a ranges-library compatible generator that generate 1, 2, 4, 8, 16, ...
        auto multiples_of_2 = views::generate(powers_of_k(2));

        auto v = vector<short>{1, 1, 0, 1, 1}; // base 10 repr. of binary number: 1*1 + 2*1 + 4*0 + 8*1 + 16*1

        auto result = inner_product(v | views::reverse, multiples_of_2, 0);
        std::cout << result << std::endl;

        horizontal_line();

        // this is the old-school version! very prone to bugs.
        auto sum = 0;
        auto k = 1;
        for(int i=v.size()-1; i>=0; --i)
        {
            sum += k * v[i];
            k *= 2;
        }
        std::cout << sum << std::endl;
    }
    new_line();

    // you can easily sort things with ranges library
    {
        v1 |= actions::sort;
        for(auto a : v1)
            std::cout << a << std::endl;
    }
    new_line();

    // you can easily get non-repeating (unique) elements with ranges library
    {
        auto v = vector<int>{10, 10, 5, 5, 5, 20, 5, 10};
        v |= actions::unique; // produces 10, 5, 20, 5, 10
        for(auto a : v)
            std::cout << a << std::endl;
    }
    return 0;
}